

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_helper.h
# Opt level: O2

void serialization::unserialize_helper<serialization::xml_iarchive,std::__cxx11::string,Person>
               (xml_iarchive *ar,
               pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>
               *v)

{
  xml_iarchive::load_key_start(ar,"first");
  xml_iarchive::load(ar,&v->first);
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  pop_back(&(ar->stack_).c);
  xml_iarchive::load_key_start(ar,"second");
  Person::unserialize_impl<serialization::xml_iarchive>(&v->second,ar);
  std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>::
  pop_back(&(ar->stack_).c);
  return;
}

Assistant:

inline void unserialize_helper(const Archive & ar, std::pair<Key, Value> & v)
{
    serialization_trace trace(__func__, __FILE__, __LINE__);
    ar.load_object_start();

    ar.load_key_start("first");
    unserialize_helper(ar, v.first);
    ar.load_key_end("first");

    ar.load_key_start("second");
    unserialize_helper(ar, v.second);
    ar.load_key_end("second");

    ar.load_object_end();
}